

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O0

void AM_drawKeys(void)

{
  int iVar1;
  uint uVar2;
  AMColor *pAVar3;
  mline_t *lineguy;
  TAngle<double> local_80;
  uint local_78;
  TFlags<ActorFlag,_unsigned_int> local_74;
  int c;
  TAngle<double> local_68;
  undefined1 local_60 [8];
  DVector3 pos;
  AKey *key;
  TThinkerIterator<AKey> it;
  DAngle angle;
  mpoint_t p;
  AMColor color;
  
  TAngle<double>::TAngle((TAngle<double> *)&it.super_FThinkerIterator.m_Stat);
  TThinkerIterator<AKey>::TThinkerIterator((TThinkerIterator<AKey> *)&key,0x80);
  while (pos.Z = (double)TThinkerIterator<AKey>::Next((TThinkerIterator<AKey> *)&key,false),
        (AActor *)pos.Z != (AActor *)0x0) {
    AActor::PosRelative((DVector3 *)local_60,(AActor *)pos.Z,MapPortalGroup);
    angle.Degrees = (double)local_60;
    p.x = pos.X;
    TAngle<double>::operator=
              ((TAngle<double> *)&it.super_FThinkerIterator.m_Stat,
               (TAngle<double> *)((long)pos.Z + 0xb0));
    iVar1 = FIntCVar::operator_cast_to_int(&am_rotate);
    if ((iVar1 == 1) ||
       ((iVar1 = FIntCVar::operator_cast_to_int(&am_rotate), iVar1 == 2 && ((viewactive & 1U) != 0))
       )) {
      AM_rotatePoint(&angle.Degrees,&p.x);
      TObjPtr<AActor>::operator->((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
      TAngle<double>::operator-((TAngle<double> *)&c);
      TAngle<double>::operator+(&local_68,90.0);
      TAngle<double>::operator+=((TAngle<double> *)&it.super_FThinkerIterator.m_Stat,&local_68);
    }
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_74,
               SUB84(pos.Z,0) +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_74);
    if (uVar2 != 0) {
      local_78 = P_GetMapColorForKey((AInventory *)pos.Z);
      if ((int)local_78 < 0) {
        pAVar3 = AMColorset::operator[](&AMColors,9);
        p.y = *(double *)pAVar3;
      }
      else {
        AMColor::FromRGB((AMColor *)&p.y,(int)local_78 >> 0x10 & 0xff,(int)local_78 >> 8 & 0xff,
                         local_78 & 0xff);
      }
      lineguy = TArray<mline_t,_mline_t>::operator[](&EasyKey,0);
      uVar2 = TArray<mline_t,_mline_t>::Size(&EasyKey);
      TAngle<double>::TAngle(&local_80,0.0);
      AM_drawLineCharacter(lineguy,uVar2,0.0,&local_80,(AMColor *)&p.y,angle.Degrees,p.x);
    }
  }
  return;
}

Assistant:

void AM_drawKeys ()
{
	AMColor color;
	mpoint_t p;
	DAngle	 angle;

	TThinkerIterator<AKey> it;
	AKey *key;

	while ((key = it.Next()) != NULL)
	{
		DVector3 pos = key->PosRelative(MapPortalGroup);
		p.x = pos.X;
		p.y = pos.Y;

		angle = key->Angles.Yaw;

		if (am_rotate == 1 || (am_rotate == 2 && viewactive))
		{
			AM_rotatePoint (&p.x, &p.y);
			angle += -players[consoleplayer].camera->Angles.Yaw + 90.;
		}

		if (key->flags & MF_SPECIAL)
		{
			// Find the key's own color.
			// Only works correctly if single-key locks have lower numbers than any-key locks.
			// That is the case for all default keys, however.
			int P_GetMapColorForKey (AInventory * key);
			int c = P_GetMapColorForKey(key);

			if (c >= 0)	color.FromRGB(RPART(c), GPART(c), BPART(c));
			else color = AMColors[AMColors.ThingColor_CountItem];
			AM_drawLineCharacter(&EasyKey[0], EasyKey.Size(), 0, 0., color, p.x, p.y);
		}
	}
}